

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int get_thread_siblings(int cpuid)

{
  uint in_EDI;
  int nscan;
  int thread_siblings;
  FILE *fp;
  char path [256];
  int local_114;
  FILE *local_110;
  char local_108 [260];
  int local_4;
  
  sprintf(local_108,"/sys/devices/system/cpu/cpu%d/topology/thread_siblings",(ulong)in_EDI);
  local_110 = fopen(local_108,"rb");
  if (local_110 == (FILE *)0x0) {
    local_4 = -1;
  }
  else {
    local_114 = -1;
    __isoc99_fscanf(local_110,"%x",&local_114);
    fclose(local_110);
    local_4 = local_114;
  }
  return local_4;
}

Assistant:

static int get_thread_siblings(int cpuid)
{
    char path[256];
    sprintf(path, "/sys/devices/system/cpu/cpu%d/topology/thread_siblings", cpuid);

    FILE* fp = fopen(path, "rb");
    if (!fp)
        return -1;

    int thread_siblings = -1;
    int nscan = fscanf(fp, "%x", &thread_siblings);
    if (nscan != 1)
    {
        // ignore
    }

    fclose(fp);

    return thread_siblings;
}